

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicWait
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,AtomicWait *curr)

{
  Memory *pMVar1;
  
  pMVar1 = Module::getMemory(this->wasm,(Name)(curr->memory).super_IString.str);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->ptr,(Type)(pMVar1->addressType).id);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->expected,(Type)(curr->expectedType).id);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->timeout,(Type)0x3);
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    notePointer(&curr->ptr, curr->memory);
    note(&curr->expected, curr->expectedType);
    note(&curr->timeout, Type::i64);
  }